

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool InputTextFilterCharacter
               (uint *p_char,ImGuiInputTextFlags flags,ImGuiInputTextCallback callback,
               void *user_data)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  bool local_72;
  bool local_71;
  undefined1 local_70 [8];
  ImGuiInputTextCallbackData callback_data;
  bool pass;
  uint c;
  void *user_data_local;
  ImGuiInputTextCallback callback_local;
  ImGuiInputTextFlags flags_local;
  uint *p_char_local;
  
  callback_data.SelectionEnd = *p_char;
  if ((uint)callback_data.SelectionEnd < 0x20) {
    bVar1 = (flags & 0x100000U) != 0;
    local_71 = callback_data.SelectionEnd == 10U && bVar1;
    bVar3 = (flags & 0x400U) != 0;
    local_72 = callback_data.SelectionEnd == 9U && bVar3;
    callback_data.SelectionStart._3_1_ = local_71 || local_72;
    if ((callback_data.SelectionEnd != 10U || !bVar1) &&
        (callback_data.SelectionEnd != 9U || !bVar3)) {
      return false;
    }
  }
  if (callback_data.SelectionEnd == 0x7f) {
    p_char_local._7_1_ = false;
  }
  else if (((uint)callback_data.SelectionEnd < 0xe000) ||
          (0xf8ff < (uint)callback_data.SelectionEnd)) {
    if ((uint)callback_data.SelectionEnd < 0x10000) {
      if ((flags & 0x2000fU) != 0) {
        if ((((flags & 1U) != 0) &&
            ((((uint)callback_data.SelectionEnd < 0x30 || (0x39 < (uint)callback_data.SelectionEnd))
             && (callback_data.SelectionEnd != 0x2e)))) &&
           ((((callback_data.SelectionEnd != 0x2d && (callback_data.SelectionEnd != 0x2b)) &&
             (callback_data.SelectionEnd != 0x2a)) && (callback_data.SelectionEnd != 0x2f)))) {
          return false;
        }
        if ((((flags & 0x20000U) != 0) &&
            (((uint)callback_data.SelectionEnd < 0x30 || (0x39 < (uint)callback_data.SelectionEnd)))
            ) && ((callback_data.SelectionEnd != 0x2e &&
                  (((((callback_data.SelectionEnd != 0x2d && (callback_data.SelectionEnd != 0x2b))
                     && (callback_data.SelectionEnd != 0x2a)) &&
                    ((callback_data.SelectionEnd != 0x2f && (callback_data.SelectionEnd != 0x65))))
                   && (callback_data.SelectionEnd != 0x45)))))) {
          return false;
        }
        if (((((flags & 2U) != 0) &&
             (((uint)callback_data.SelectionEnd < 0x30 || (0x39 < (uint)callback_data.SelectionEnd))
             )) && (((uint)callback_data.SelectionEnd < 0x61 ||
                    (0x66 < (uint)callback_data.SelectionEnd)))) &&
           (((uint)callback_data.SelectionEnd < 0x41 || (0x46 < (uint)callback_data.SelectionEnd))))
        {
          return false;
        }
        if ((((flags & 4U) != 0) && (0x60 < (uint)callback_data.SelectionEnd)) &&
           ((uint)callback_data.SelectionEnd < 0x7b)) {
          callback_data.SelectionEnd = callback_data.SelectionEnd - 0x20;
          *p_char = callback_data.SelectionEnd;
        }
        if (((flags & 8U) != 0) && (bVar1 = ImCharIsBlankW(callback_data.SelectionEnd), bVar1)) {
          return false;
        }
      }
      if ((flags & 0x200U) != 0) {
        ImGuiInputTextCallbackData::ImGuiInputTextCallbackData
                  ((ImGuiInputTextCallbackData *)local_70);
        memset(local_70,0,0x38);
        local_70._0_4_ = 0x200;
        callback_data.UserData._0_2_ = (ushort)callback_data.SelectionEnd;
        local_70._4_4_ = flags;
        callback_data._0_8_ = user_data;
        iVar2 = (*callback)((ImGuiInputTextCallbackData *)local_70);
        if (iVar2 != 0) {
          return false;
        }
        *p_char = (uint)(ushort)callback_data.UserData;
        if ((ushort)callback_data.UserData == 0) {
          return false;
        }
      }
      p_char_local._7_1_ = true;
    }
    else {
      p_char_local._7_1_ = false;
    }
  }
  else {
    p_char_local._7_1_ = false;
  }
  return p_char_local._7_1_;
}

Assistant:

static bool InputTextFilterCharacter(unsigned int* p_char, ImGuiInputTextFlags flags, ImGuiInputTextCallback callback, void* user_data)
{
    unsigned int c = *p_char;

    // Filter non-printable (NB: isprint is unreliable! see #2467)
    if (c < 0x20)
    {
        bool pass = false;
        pass |= (c == '\n' && (flags & ImGuiInputTextFlags_Multiline));
        pass |= (c == '\t' && (flags & ImGuiInputTextFlags_AllowTabInput));
        if (!pass)
            return false;
    }

    // We ignore Ascii representation of delete (emitted from Backspace on OSX, see #2578, #2817)
    if (c == 127)
        return false;

    // Filter private Unicode range. GLFW on OSX seems to send private characters for special keys like arrow keys (FIXME)
    if (c >= 0xE000 && c <= 0xF8FF)
        return false;

    // Filter Unicode ranges we are not handling in this build.
    if (c > IM_UNICODE_CODEPOINT_MAX)
        return false;

    // Generic named filters
    if (flags & (ImGuiInputTextFlags_CharsDecimal | ImGuiInputTextFlags_CharsHexadecimal | ImGuiInputTextFlags_CharsUppercase | ImGuiInputTextFlags_CharsNoBlank | ImGuiInputTextFlags_CharsScientific))
    {
        if (flags & ImGuiInputTextFlags_CharsDecimal)
            if (!(c >= '0' && c <= '9') && (c != '.') && (c != '-') && (c != '+') && (c != '*') && (c != '/'))
                return false;

        if (flags & ImGuiInputTextFlags_CharsScientific)
            if (!(c >= '0' && c <= '9') && (c != '.') && (c != '-') && (c != '+') && (c != '*') && (c != '/') && (c != 'e') && (c != 'E'))
                return false;

        if (flags & ImGuiInputTextFlags_CharsHexadecimal)
            if (!(c >= '0' && c <= '9') && !(c >= 'a' && c <= 'f') && !(c >= 'A' && c <= 'F'))
                return false;

        if (flags & ImGuiInputTextFlags_CharsUppercase)
            if (c >= 'a' && c <= 'z')
                *p_char = (c += (unsigned int)('A'-'a'));

        if (flags & ImGuiInputTextFlags_CharsNoBlank)
            if (ImCharIsBlankW(c))
                return false;
    }

    // Custom callback filter
    if (flags & ImGuiInputTextFlags_CallbackCharFilter)
    {
        ImGuiInputTextCallbackData callback_data;
        memset(&callback_data, 0, sizeof(ImGuiInputTextCallbackData));
        callback_data.EventFlag = ImGuiInputTextFlags_CallbackCharFilter;
        callback_data.EventChar = (ImWchar)c;
        callback_data.Flags = flags;
        callback_data.UserData = user_data;
        if (callback(&callback_data) != 0)
            return false;
        *p_char = callback_data.EventChar;
        if (!callback_data.EventChar)
            return false;
    }

    return true;
}